

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTxIn::ConfidentialTxIn(ConfidentialTxIn *this,Txid *txid,uint32_t index)

{
  uint32_t index_local;
  Txid *txid_local;
  ConfidentialTxIn *this_local;
  
  AbstractTxIn::AbstractTxIn(&this->super_AbstractTxIn,txid,index,0);
  (this->super_AbstractTxIn)._vptr_AbstractTxIn = (_func_int **)&PTR__ConfidentialTxIn_003ebf88;
  ByteData256::ByteData256(&this->blinding_nonce_);
  ByteData256::ByteData256(&this->asset_entropy_);
  ConfidentialValue::ConfidentialValue(&this->issuance_amount_);
  ConfidentialValue::ConfidentialValue(&this->inflation_keys_);
  ByteData::ByteData(&this->issuance_amount_rangeproof_);
  ByteData::ByteData(&this->inflation_keys_rangeproof_);
  ScriptWitness::ScriptWitness(&this->pegin_witness_);
  return;
}

Assistant:

ConfidentialTxIn::ConfidentialTxIn(const Txid &txid, uint32_t index)
    : AbstractTxIn(txid, index, 0),
      blinding_nonce_(),
      asset_entropy_(),
      issuance_amount_(),
      inflation_keys_(),
      issuance_amount_rangeproof_(),
      inflation_keys_rangeproof_(),
      pegin_witness_() {
  // do nothing
}